

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O0

void pzshape::TPZShapeLinear::Chebyshev
               (REAL x,int num,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double dVar1;
  long *plVar2;
  long col;
  double *pdVar3;
  long lVar4;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  double in_XMM0_Qa;
  double dVar5;
  int ord;
  double in_stack_ffffffffffffff88;
  TPZFMatrix<double> *in_stack_ffffffffffffff90;
  double local_50;
  double local_48;
  int local_3c;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  long *local_20;
  long *local_18;
  int local_c;
  double local_8;
  
  if (0 < in_EDI) {
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_c = in_EDI;
    local_8 = in_XMM0_Qa;
    (**(code **)(*in_RSI + 0x78))();
    (**(code **)(*local_20 + 0x78))();
    local_28 = 0x3ff0000000000000;
    (**(code **)(*local_18 + 0x100))(local_18,0,0,&local_28);
    local_30 = 0;
    (**(code **)(*local_20 + 0x100))(local_20,0,0,&local_30);
    if (local_c != 1) {
      (**(code **)(*local_18 + 0x100))(local_18,1,0,&local_8);
      local_38 = 0x3ff0000000000000;
      (**(code **)(*local_20 + 0x100))(local_20,0,1,&local_38);
      for (local_3c = 2; plVar2 = local_18, local_3c < local_c; local_3c = local_3c + 1) {
        col = (long)local_3c;
        dVar5 = local_8 * 2.0;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,col);
        dVar1 = *pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,col);
        local_48 = dVar5 * dVar1 + -*pdVar3;
        (**(code **)(*plVar2 + 0x100))(plVar2,col,0,&local_48);
        plVar2 = local_20;
        lVar4 = (long)local_3c;
        in_stack_ffffffffffffff88 = local_8 * 2.0;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,col);
        in_stack_ffffffffffffff90 = (TPZFMatrix<double> *)*pdVar3;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,col);
        dVar1 = *pdVar3;
        dVar5 = in_stack_ffffffffffffff88 * (double)in_stack_ffffffffffffff90;
        pdVar3 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88,col);
        local_50 = (dVar5 + dVar1 * 2.0) - *pdVar3;
        (**(code **)(*plVar2 + 0x100))(plVar2,0,lVar4,&local_50);
      }
    }
  }
  return;
}

Assistant:

void TPZShapeLinear::Chebyshev(REAL x,int num,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi){
		// Quadratic or higher shape functions
		if(num <= 0) return;
        phi.Zero();
        dphi.Zero();
		phi.Put(0,0,1.0);
		dphi.Put(0,0, 0.0);
		if(num == 1) return;
		phi.Put(1,0, x);
		dphi.Put(0,1, 1.0);
		int ord;
       // dphi.Print("DphisAntes = ",std::cout,EMathematicaInput);
    
		for(ord = 2;ord<num;ord++) {
			phi.Put(ord,0, 2.0*x*phi(ord-1,0) - phi(ord-2,0));
			dphi.Put(0,ord, 2.0*x*dphi(0,ord-1) + 2.0*phi(ord-1,0) - dphi(0,ord-2));
		}
       // dphi.Print("DphisDepois = ",std::cout,EMathematicaInput);
	}